

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O3

int zmq_send_const(void *s_,void *buf_,size_t len_,int flags_)

{
  int iVar1;
  socket_base_t *this;
  size_t sVar2;
  ssize_t sVar3;
  size_t __n;
  size_t sVar4;
  int iVar5;
  int __flags;
  zmq_msg_t msg;
  msg_t mStack_68;
  
  this = as_socket_base_t(s_);
  if (this == (socket_base_t *)0x0) {
    iVar5 = -1;
  }
  else {
    __n = 0;
    __flags = 0;
    iVar1 = zmq::msg_t::init_data(&mStack_68,buf_,len_,(undefined1 *)0x0,(void *)0x0);
    iVar5 = -1;
    if (iVar1 == 0) {
      sVar2 = zmq::msg_t::size(&mStack_68);
      sVar3 = zmq::socket_base_t::send(this,(int)&mStack_68,(void *)(ulong)(uint)flags_,__n,__flags)
      ;
      sVar4 = 0x7fffffff;
      if (sVar2 < 0x7fffffff) {
        sVar4 = sVar2;
      }
      if ((int)sVar3 < 0) {
        zmq_send_const_cold_1();
      }
      else {
        iVar5 = (int)sVar4;
      }
    }
  }
  return iVar5;
}

Assistant:

int zmq_send_const (void *s_, const void *buf_, size_t len_, int flags_)
{
    zmq::socket_base_t *s = as_socket_base_t (s_);
    if (!s)
        return -1;
    zmq_msg_t msg;
    int rc =
      zmq_msg_init_data (&msg, const_cast<void *> (buf_), len_, NULL, NULL);
    if (rc != 0)
        return -1;

    rc = s_sendmsg (s, &msg, flags_);
    if (unlikely (rc < 0)) {
        const int err = errno;
        const int rc2 = zmq_msg_close (&msg);
        errno_assert (rc2 == 0);
        errno = err;
        return -1;
    }
    //  Note the optimisation here. We don't close the msg object as it is
    //  empty anyway. This may change when implementation of zmq_msg_t changes.
    return rc;
}